

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O1

void sx__del_job(sx_job_context *ctx,sx__job *job)

{
  int iVar1;
  sx_pool *psVar2;
  sx__job *psVar3;
  code *pcVar4;
  sx_lock_t sVar5;
  uintptr_t uptr;
  sx__pool_page *psVar6;
  
  LOCK();
  sVar5 = ctx->job_lk;
  ctx->job_lk = 1;
  UNLOCK();
  while (sVar5 != 0) {
    do {
    } while (ctx->job_lk != 0);
    LOCK();
    sVar5 = ctx->job_lk;
    ctx->job_lk = 1;
    UNLOCK();
  }
  psVar2 = ctx->job_pool;
  psVar6 = psVar2->pages;
  if (psVar6 != (sx__pool_page *)0x0) {
    do {
      psVar3 = (sx__job *)psVar6->buff;
      if ((psVar3 <= job) &&
         (job < (sx__job *)
                ((long)&psVar3->job_index + (long)psVar2->item_sz * (long)psVar2->capacity))) {
        if ((ulong)((long)job - (long)psVar3) % (ulong)(long)psVar2->item_sz != 0) {
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                            ,0xd6,"ptr is not aligned to items, probably invalid");
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
        if (psVar6->iter == psVar2->capacity) {
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                            ,0xd8,"cannot delete more objects, possible double delete");
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
        iVar1 = psVar6->iter;
        psVar6->iter = iVar1 + 1;
        psVar6->ptrs[iVar1] = job;
        ctx->job_lk = 0;
        return;
      }
      psVar6 = psVar6->next;
    } while (psVar6 != (sx__pool_page *)0x0);
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                    ,0xe0,"pointer does not blong to the pool");
  pcVar4 = (code *)swi(3);
  (*pcVar4)();
  return;
}

Assistant:

static void sx__del_job(sx_job_context* ctx, sx__job* job)
{
    sx_lock(ctx->job_lk) {
        sx_pool_del(ctx->job_pool, job);
    }
}